

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# init.c
# Opt level: O0

parser_error parse_shape_name(parser *p)

{
  ushort uVar1;
  void *pvVar2;
  undefined8 *v;
  char *pcVar3;
  int local_24;
  wchar_t i;
  player_shape *shape;
  player_shape *h;
  parser *p_local;
  
  pvVar2 = parser_priv(p);
  v = (undefined8 *)mem_zalloc(0x118);
  for (local_24 = 0; local_24 < 0x1c; local_24 = local_24 + 1) {
    *(undefined2 *)((long)v + (long)local_24 * 4 + 0x90) = 100;
  }
  *v = pvVar2;
  pcVar3 = parser_getstr(p,"name");
  pcVar3 = string_make(pcVar3);
  v[1] = pcVar3;
  parser_setpriv(p,v);
  uVar1 = z_info->shape_max;
  z_info->shape_max = uVar1 + 1;
  *(uint *)(v + 2) = (uint)uVar1;
  return PARSE_ERROR_NONE;
}

Assistant:

static enum parser_error parse_shape_name(struct parser *p) {
	struct player_shape *h = parser_priv(p);
	struct player_shape *shape = mem_zalloc(sizeof *shape);
	int i;

	for (i = 0; i < ELEM_MAX; i++) {
		shape->el_info[i].res_level = RES_LEVEL_BASE;
	}
	shape->next = h;
	shape->name = string_make(parser_getstr(p, "name"));
	parser_setpriv(p, shape);
	shape->sidx = z_info->shape_max++;
	return PARSE_ERROR_NONE;
}